

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Vec_Wec_t * Gia_ManCreateNodeSupps(Gia_Man_t *p,Vec_Int_t *vNodes,int fVerbose)

{
  int iVar1;
  undefined8 uVar2;
  void *__ptr;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *__ptr_00;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  timespec ts;
  long local_60;
  timespec local_48;
  Gia_Man_t *local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_60 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = vNodes->nSize;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar4 = 8;
  }
  pVVar7->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar7->pArray = pVVar8;
  pVVar7->nSize = iVar3;
  iVar3 = p->nObjs;
  __ptr_00 = (int *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar3 - 1U) {
    iVar4 = iVar3;
  }
  *__ptr_00 = iVar4;
  if (iVar4 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = calloc((long)iVar4,0x10);
  }
  *(void **)(__ptr_00 + 2) = pvVar9;
  __ptr_00[1] = iVar3;
  pVVar8 = p->vCis;
  iVar4 = iVar3;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar8->pArray[lVar12];
      if (((long)iVar1 < 0) || (iVar4 = p->nObjs, iVar4 <= iVar1)) goto LAB_001f1fd5;
      if (iVar1 == 0) goto LAB_001f1d54;
      if (iVar3 <= iVar1) goto LAB_001f1fb6;
      Vec_IntPush((Vec_Int_t *)((long)iVar1 * 0x10 + (long)pvVar9),(int)lVar12);
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCis;
    } while (lVar12 < pVVar8->nSize);
    iVar4 = p->nObjs;
  }
  if (0 < iVar4) {
LAB_001f1d54:
    lVar14 = 0;
    lVar12 = 0;
    uVar13 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar2 = *(undefined8 *)(&p->pObjs->field_0x0 + lVar12);
      uVar5 = (uint)uVar2;
      if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
        uVar11 = -(uVar5 & 0x1fffffff) + uVar13;
        iVar3 = (int)uVar11;
        if (iVar3 < 0) goto LAB_001f1fb6;
        uVar5 = __ptr_00[1];
        if ((int)uVar5 <= iVar3) goto LAB_001f1fb6;
        uVar10 = -((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff) + uVar13;
        uVar6 = (uint)uVar10;
        if ((((int)uVar6 < 0) || (uVar5 <= uVar6)) || (uVar5 <= uVar13)) goto LAB_001f1fb6;
        lVar15 = *(long *)(__ptr_00 + 2);
        Vec_IntTwoMerge2((Vec_Int_t *)((uVar11 & 0xffffffff) * 0x10 + lVar15),
                         (Vec_Int_t *)((uVar10 & 0xffffffff) * 0x10 + lVar15),
                         (Vec_Int_t *)(lVar15 + lVar14));
        iVar4 = p->nObjs;
      }
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0xc;
      lVar14 = lVar14 + 0x10;
    } while ((long)uVar13 < (long)iVar4);
  }
  iVar3 = vNodes->nSize;
  if (0 < iVar3) {
    lVar12 = 0;
    local_38 = p;
    do {
      iVar4 = vNodes->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_001f1fd5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((pVVar7->nSize <= lVar12) || (__ptr_00[1] <= iVar4)) {
LAB_001f1fb6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar14 = (long)iVar4 * 0x10;
      if (0 < *(int *)(*(long *)(__ptr_00 + 2) + 4 + lVar14)) {
        pVVar8 = pVVar7->pArray;
        lVar14 = *(long *)(__ptr_00 + 2) + lVar14;
        lVar15 = 0;
        do {
          Vec_IntPush(pVVar8 + lVar12,*(int *)(*(long *)(lVar14 + 8) + lVar15 * 4));
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)(lVar14 + 4));
        iVar3 = vNodes->nSize;
        p = local_38;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < iVar3);
  }
  iVar3 = *__ptr_00;
  pvVar9 = *(void **)(__ptr_00 + 2);
  if ((long)iVar3 < 1) {
    if (pvVar9 == (void *)0x0) goto LAB_001f1f04;
  }
  else {
    lVar12 = 0;
    do {
      __ptr = *(void **)((long)pvVar9 + lVar12 + 8);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)pvVar9 + lVar12 + 8) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar12);
  }
  free(pvVar9);
LAB_001f1f04:
  free(__ptr_00);
  if (fVerbose != 0) {
    iVar3 = clock_gettime(3,&local_48);
    if (iVar3 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(1,"%s =","Support computation");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar12 + local_60) / 1000000.0);
  }
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManCreateNodeSupps( Gia_Man_t * p, Vec_Int_t * vNodes, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsNo = Vec_WecStart( Vec_IntSize(vNodes) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsNo, i), Vec_WecEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsNo;
}